

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O1

size_t __thiscall
axl::enc::CharCodec::encode_utf32
          (CharCodec *this,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,StringRef_utf32 *string
          ,utf32_t replacement)

{
  C *pCVar1;
  size_t sVar2;
  long lVar3;
  C *pCVar4;
  char cVar5;
  undefined1 auVar6 [16];
  char tmpBuffer [256];
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> local_158;
  char local_138 [264];
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(buffer,0);
  pCVar4 = string->m_p;
  pCVar1 = pCVar4 + string->m_length;
  do {
    if (pCVar1 <= pCVar4) goto LAB_001438ba;
    lVar3 = (long)pCVar1 - (long)pCVar4;
    local_158.m_length._0_1_ = 0;
    local_158.m_length._1_7_ = 0;
    local_158.m_isNullTerminated = false;
    local_158.m_p = (C *)0x0;
    local_158.m_hdr._0_1_ = 0;
    local_158.m_hdr._1_7_ = 0;
    sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::attachBufHdr
              (&local_158,(BufHdr *)0x0);
    local_158.m_length._0_1_ = (undefined1)(lVar3 >> 2);
    local_158.m_length._1_7_ = (int7)(lVar3 >> 10);
    local_158.m_isNullTerminated = false;
    local_158.m_p = pCVar4;
    auVar6 = (**(code **)(*(long *)this + 0x40))(this,local_138,0x100,&local_158,replacement);
    lVar3 = auVar6._8_8_;
    sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release(&local_158);
    if (lVar3 == 0) {
      cVar5 = '\x03';
    }
    else {
      sVar2 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                        (buffer,0xffffffffffffffff,local_138,auVar6._0_8_);
      cVar5 = sVar2 == 0xffffffffffffffff;
      if ((bool)cVar5) {
        lVar3 = 0;
      }
      pCVar4 = pCVar4 + lVar3;
    }
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
LAB_001438ba:
    sVar2 = (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

size_t
CharCodec::encode_utf32(
	sl::Array<char>* buffer,
	const sl::StringRef_utf32& string,
	utf32_t replacement
) {
	buffer->clear();

	const utf32_t* p = string.cp();
	const utf32_t* end = string.getEnd();
	while (p < end) {
		char tmpBuffer[256];
		ConvertLengthResult result = encode_utf32(
			tmpBuffer,
			sizeof(tmpBuffer),
			sl::StringRef_utf32(p, end - p),
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t size = buffer->append(tmpBuffer, result.m_dstLength);
		if (size == -1)
			return -1;

		p += result.m_srcLength;
	}

	return buffer->getCount();
}